

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O2

void __thiscall
cmCPackIFWRepository::WriteRepositoryUpdate(cmCPackIFWRepository *this,cmXMLWriter *xout)

{
  Action AVar1;
  char *name;
  long lStack_50;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Repository",&local_39);
  cmXMLWriter::StartElement(xout,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  AVar1 = this->Update;
  if (AVar1 == Add) {
    cmXMLWriter::Attribute<char[4]>(xout,"action",(char (*) [4])0x5dc199);
LAB_0017724c:
    AVar1 = this->Update;
  }
  else {
    if (AVar1 == Remove) {
      cmXMLWriter::Attribute<char[7]>(xout,"action",(char (*) [7])0x5dc17b);
      goto LAB_0017724c;
    }
    if (AVar1 == Replace) {
      cmXMLWriter::Attribute<char[8]>(xout,"action",(char (*) [8])"replace");
      goto LAB_0017724c;
    }
  }
  if (AVar1 - Add < 2) {
    name = "url";
    lStack_50 = 0x30;
  }
  else {
    if (AVar1 != Replace) goto LAB_00177290;
    cmXMLWriter::Attribute<std::__cxx11::string>(xout,"oldUrl",&this->OldUrl);
    name = "newUrl";
    lStack_50 = 0x70;
  }
  cmXMLWriter::Attribute<std::__cxx11::string>
            (xout,name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(this->super_cmCPackIFWCommon).Generator + lStack_50));
LAB_00177290:
  if ((this->Enabled)._M_string_length != 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>(xout,"enabled",&this->Enabled);
  }
  if ((this->Username)._M_string_length != 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>(xout,"username",&this->Username);
  }
  if ((this->Password)._M_string_length != 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>(xout,"password",&this->Password);
  }
  if ((this->DisplayName)._M_string_length != 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>(xout,"displayname",&this->DisplayName);
  }
  cmXMLWriter::EndElement(xout);
  return;
}

Assistant:

void cmCPackIFWRepository::WriteRepositoryUpdate(cmXMLWriter& xout) const
{
  xout.StartElement("Repository");

  switch (this->Update) {
    case cmCPackIFWRepository::None:
      break;
    case cmCPackIFWRepository::Add:
      xout.Attribute("action", "add");
      break;
    case cmCPackIFWRepository::Remove:
      xout.Attribute("action", "remove");
      break;
    case cmCPackIFWRepository::Replace:
      xout.Attribute("action", "replace");
      break;
  }

  // Url
  if (this->Update == cmCPackIFWRepository::Add ||
      this->Update == cmCPackIFWRepository::Remove) {
    xout.Attribute("url", this->Url);
  } else if (this->Update == cmCPackIFWRepository::Replace) {
    xout.Attribute("oldUrl", this->OldUrl);
    xout.Attribute("newUrl", this->NewUrl);
  }
  // Enabled
  if (!this->Enabled.empty()) {
    xout.Attribute("enabled", this->Enabled);
  }
  // Username
  if (!this->Username.empty()) {
    xout.Attribute("username", this->Username);
  }
  // Password
  if (!this->Password.empty()) {
    xout.Attribute("password", this->Password);
  }
  // DisplayName
  if (!this->DisplayName.empty()) {
    xout.Attribute("displayname", this->DisplayName);
  }

  xout.EndElement();
}